

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNumber<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<false>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,VWReaderHandler<false> *handler)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  Ch *pCVar4;
  Ch *pCVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  ulong v;
  int iVar9;
  uint v_00;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  byte *pbVar14;
  byte *pbVar15;
  ulong uVar16;
  undefined4 uVar17;
  bool bVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  pbVar3 = (byte *)is->src_;
  bVar2 = *pbVar3;
  pbVar15 = pbVar3;
  bVar8 = bVar2;
  if (bVar2 == 0x2d) {
    pbVar15 = pbVar3 + 1;
    bVar8 = pbVar3[1];
  }
  pCVar4 = is->dst_;
  pCVar5 = is->head_;
  uVar17 = 0xd;
  if (bVar8 == 0x30) {
    bVar8 = pbVar15[1];
    pbVar14 = pbVar15 + 1;
    uVar16 = 0;
    v_00 = 0;
LAB_0019cb1a:
    uVar11 = (uint)bVar8;
    bVar18 = false;
    bVar7 = false;
    v = 0;
    dVar19 = 0.0;
    bVar6 = false;
    goto LAB_0019cbe9;
  }
  if ((byte)(bVar8 - 0x31) < 9) {
    v_00 = bVar8 - 0x30;
    uVar16 = 0;
    if (bVar2 == 0x2d) {
LAB_0019ca28:
      bVar8 = pbVar15[uVar16 + 1];
      uVar12 = (ulong)bVar8;
      if (9 < (byte)(bVar8 - 0x30)) goto LAB_0019cb09;
      if (v_00 < 0xccccccc) {
LAB_0019ca41:
        v_00 = (v_00 * 10 + (uint)bVar8) - 0x30;
        uVar16 = uVar16 + 1;
        goto LAB_0019ca28;
      }
      uVar11 = v_00;
      if (v_00 != 0xccccccc) goto LAB_0019caaf;
      if (bVar8 < 0x39) goto LAB_0019ca41;
      uVar12 = 0x39;
      uVar11 = 0xccccccc;
LAB_0019caaf:
      v_00 = uVar11;
      pbVar14 = pbVar15 + uVar16 + 1;
      v = (ulong)v_00;
      if (bVar2 == 0x2d) {
        while( true ) {
          uVar11 = (uint)uVar12;
          if (9 < (byte)((byte)uVar12 - 0x30)) break;
          if ((0xccccccccccccccb < v) && (0x38 < (byte)uVar12 || v != 0xccccccccccccccc))
          goto LAB_0019cb72;
          v = (uVar12 & 0xf) + v * 10;
          uVar16 = (ulong)((int)uVar16 + 1);
          uVar12 = (ulong)pbVar14[1];
          pbVar14 = pbVar14 + 1;
        }
      }
      else {
        while( true ) {
          uVar11 = (uint)uVar12;
          if (9 < (byte)((byte)uVar12 - 0x30)) break;
          if ((0x1999999999999998 < v) && (0x35 < (byte)uVar12 || v != 0x1999999999999999))
          goto LAB_0019cb72;
          v = (uVar12 & 0xf) + v * 10;
          uVar16 = (ulong)((int)uVar16 + 1);
          uVar12 = (ulong)pbVar14[1];
          pbVar14 = pbVar14 + 1;
        }
      }
      dVar19 = 0.0;
      bVar6 = true;
      bVar18 = false;
      bVar7 = false;
      goto LAB_0019cbe9;
    }
    while( true ) {
      bVar8 = pbVar15[uVar16 + 1];
      uVar12 = (ulong)bVar8;
      if (9 < (byte)(bVar8 - 0x30)) break;
      if ((0x19999998 < v_00) &&
         ((uVar11 = v_00, v_00 != 0x19999999 || (uVar11 = 0x19999999, 0x35 < bVar8))))
      goto LAB_0019caaf;
      v_00 = (v_00 * 10 + (uint)bVar8) - 0x30;
      uVar16 = uVar16 + 1;
    }
LAB_0019cb09:
    pbVar14 = pbVar15 + uVar16 + 1;
    goto LAB_0019cb1a;
  }
  uVar17 = 3;
  pbVar14 = pbVar15;
  goto LAB_0019ceb4;
LAB_0019cb72:
  auVar20._8_4_ = (int)(v >> 0x20);
  auVar20._0_8_ = v;
  auVar20._12_4_ = 0x45300000;
  dVar19 = (auVar20._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)v) - 4503599627370496.0);
  while (uVar11 = (uint)uVar12, (byte)((char)uVar12 - 0x30U) < 10) {
    pbVar15 = pbVar3;
    if (1.7976931348623158e+307 <= dVar19) goto LAB_0019ceb4;
    dVar19 = dVar19 * 10.0 + (double)(int)(uVar11 - 0x30);
    pbVar15 = pbVar14 + 1;
    pbVar14 = pbVar14 + 1;
    uVar12 = (ulong)*pbVar15;
  }
  bVar18 = true;
  bVar7 = true;
  bVar6 = true;
LAB_0019cbe9:
  if ((char)uVar11 == '.') {
    pbVar15 = pbVar14 + 1;
    uVar11 = (uint)*pbVar15;
    pbVar14 = pbVar14 + 1;
    if (0xf5 < (byte)(*pbVar15 - 0x3a)) {
      iVar13 = 0;
      if (!bVar18) {
        if (!bVar6) {
          v = (ulong)v_00;
        }
        iVar13 = 0;
        while ((('/' < (char)(byte)uVar11 && ((byte)uVar11 < 0x3a)) && (v >> 0x35 == 0))) {
          pbVar15 = pbVar14 + 1;
          pbVar14 = pbVar14 + 1;
          iVar13 = iVar13 + -1;
          v = (ulong)(uVar11 - 0x30) + v * 10;
          uVar16 = (ulong)((int)uVar16 + (uint)(v != 0));
          uVar11 = (uint)*pbVar15;
        }
        auVar21._8_4_ = (int)(v >> 0x20);
        auVar21._0_8_ = v;
        auVar21._12_4_ = 0x45300000;
        dVar19 = (auVar21._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)v) - 4503599627370496.0);
        bVar7 = true;
      }
      while ('/' < (char)(byte)uVar11) {
        if (0x39 < (byte)uVar11) goto LAB_0019cd0f;
        if ((int)uVar16 < 0x11) {
          dVar19 = dVar19 * 10.0 + (double)(int)(uVar11 - 0x30);
          iVar13 = iVar13 + -1;
          if (0.0 < dVar19) {
            uVar16 = (ulong)((int)uVar16 + 1);
          }
        }
        pbVar15 = pbVar14 + 1;
        pbVar14 = pbVar14 + 1;
        uVar11 = (uint)*pbVar15;
      }
      iVar10 = 0;
      goto LAB_0019ce10;
    }
    uVar17 = 0xe;
    pbVar15 = pbVar14;
  }
  else {
    iVar13 = 0;
LAB_0019cd0f:
    iVar10 = 0;
    if ((uVar11 | 0x20) == 0x65) {
      uVar16 = (ulong)v_00;
      if (bVar6) {
        uVar16 = v;
      }
      if (!bVar7) {
        auVar22._8_4_ = (int)(uVar16 >> 0x20);
        auVar22._0_8_ = uVar16;
        auVar22._12_4_ = 0x45300000;
        dVar19 = (auVar22._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar16) - 4503599627370496.0);
        bVar7 = true;
      }
      bVar8 = pbVar14[1];
      bVar18 = bVar8 != 0x2b;
      if ((bVar18) && (bVar8 != 0x2d)) {
        pbVar15 = pbVar14 + 1;
        bVar18 = false;
      }
      else {
        bVar8 = pbVar14[2];
        pbVar15 = pbVar14 + 2;
      }
      if ((byte)(bVar8 - 0x30) < 10) {
        pbVar14 = pbVar15 + 1;
        iVar9 = bVar8 - 0x30;
        pbVar15 = pbVar14;
        if (bVar18) {
          while (pbVar14 = pbVar15, (byte)(*pbVar14 - 0x30) < 10) {
            iVar9 = iVar9 * 10 + (uint)*pbVar14 + -0x30;
            pbVar15 = pbVar14 + 1;
            if (0xccccccb < iVar9) {
              do {
                pbVar1 = pbVar14 + 1;
                pbVar14 = pbVar14 + 1;
                pbVar15 = pbVar14;
              } while ((byte)(*pbVar1 - 0x30) < 10);
            }
          }
LAB_0019ce07:
          iVar10 = -iVar9;
          if (!bVar18) {
            iVar10 = iVar9;
          }
          goto LAB_0019ce10;
        }
        do {
          bVar8 = *pbVar14;
          if (9 < (byte)(bVar8 - 0x30)) goto LAB_0019ce07;
          pbVar14 = pbVar14 + 1;
          iVar9 = iVar9 * 10 + (uint)bVar8 + -0x30;
        } while (iVar9 <= 0x134 - iVar13);
        uVar17 = 0xd;
        pbVar15 = pbVar3;
      }
      else {
        uVar17 = 0xf;
        pbVar14 = pbVar15;
      }
    }
    else {
LAB_0019ce10:
      if (bVar7) {
        dVar19 = internal::StrtodNormalPrecision(dVar19,iVar10 + iVar13);
        if (bVar2 == 0x2d) {
          dVar19 = -dVar19;
        }
        bVar18 = VWReaderHandler<false>::Double(handler,dVar19);
      }
      else if (bVar6) {
        if (bVar2 == 0x2d) {
          bVar18 = VWReaderHandler<false>::Int64(handler,-v);
        }
        else {
          bVar18 = VWReaderHandler<false>::Uint64(handler,v);
        }
      }
      else if (bVar2 == 0x2d) {
        bVar18 = VWReaderHandler<false>::Int(handler,-v_00);
      }
      else {
        bVar18 = VWReaderHandler<false>::Uint(handler,v_00);
      }
      if (bVar18 != false) goto LAB_0019ce7f;
      uVar17 = 0x10;
      pbVar15 = pbVar3;
    }
  }
LAB_0019ceb4:
  *(undefined4 *)(this + 0x30) = uVar17;
  *(long *)(this + 0x38) = (long)pbVar15 - (long)pCVar5;
LAB_0019ce7f:
  is->src_ = (Ch *)pbVar14;
  is->dst_ = pCVar4;
  is->head_ = pCVar5;
  return;
}

Assistant:

void ParseNumber(InputStream& is, Handler& handler) {
        internal::StreamLocalCopy<InputStream> copy(is);
        NumberStream<InputStream,
            ((parseFlags & kParseNumbersAsStringsFlag) != 0) ?
                ((parseFlags & kParseInsituFlag) == 0) :
                ((parseFlags & kParseFullPrecisionFlag) != 0),
            (parseFlags & kParseNumbersAsStringsFlag) != 0 &&
                (parseFlags & kParseInsituFlag) == 0> s(*this, copy.s);

        size_t startOffset = s.Tell();
        double d = 0.0;
        bool useNanOrInf = false;

        // Parse minus
        bool minus = Consume(s, '-');

        // Parse int: zero / ( digit1-9 *DIGIT )
        unsigned i = 0;
        uint64_t i64 = 0;
        bool use64bit = false;
        int significandDigit = 0;
        if (RAPIDJSON_UNLIKELY(s.Peek() == '0')) {
            i = 0;
            s.TakePush();
        }
        else if (RAPIDJSON_LIKELY(s.Peek() >= '1' && s.Peek() <= '9')) {
            i = static_cast<unsigned>(s.TakePush() - '0');

            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 214748364)) { // 2^31 = 2147483648
                        if (RAPIDJSON_LIKELY(i != 214748364 || s.Peek() > '8')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 429496729)) { // 2^32 - 1 = 4294967295
                        if (RAPIDJSON_LIKELY(i != 429496729 || s.Peek() > '5')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }
        // Parse NaN or Infinity here
        else if ((parseFlags & kParseNanAndInfFlag) && RAPIDJSON_LIKELY((s.Peek() == 'I' || s.Peek() == 'N'))) {
            useNanOrInf = true;
            if (RAPIDJSON_LIKELY(Consume(s, 'N') && Consume(s, 'a') && Consume(s, 'N'))) {
                d = std::numeric_limits<double>::quiet_NaN();
            }
            else if (RAPIDJSON_LIKELY(Consume(s, 'I') && Consume(s, 'n') && Consume(s, 'f'))) {
                d = (minus ? -std::numeric_limits<double>::infinity() : std::numeric_limits<double>::infinity());
                if (RAPIDJSON_UNLIKELY(s.Peek() == 'i' && !(Consume(s, 'i') && Consume(s, 'n')
                                                            && Consume(s, 'i') && Consume(s, 't') && Consume(s, 'y'))))
                    RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());

        // Parse 64bit int
        bool useDouble = false;
        if (use64bit) {
            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                     if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC))) // 2^63 = 9223372036854775808
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC) || s.Peek() > '8')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x19999999, 0x99999999))) // 2^64 - 1 = 18446744073709551615
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x19999999, 0x99999999) || s.Peek() > '5')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }

        // Force double for big integer
        if (useDouble) {
            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (RAPIDJSON_UNLIKELY(d >= 1.7976931348623157e307)) // DBL_MAX / 10.0
                    RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                d = d * 10 + (s.TakePush() - '0');
            }
        }

        // Parse frac = decimal-point 1*DIGIT
        int expFrac = 0;
        size_t decimalPosition;
        if (Consume(s, '.')) {
            decimalPosition = s.Length();

            if (RAPIDJSON_UNLIKELY(!(s.Peek() >= '0' && s.Peek() <= '9')))
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissFraction, s.Tell());

            if (!useDouble) {
#if RAPIDJSON_64BIT
                // Use i64 to store significand in 64-bit architecture
                if (!use64bit)
                    i64 = i;

                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (i64 > RAPIDJSON_UINT64_C2(0x1FFFFF, 0xFFFFFFFF)) // 2^53 - 1 for fast path
                        break;
                    else {
                        i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                        --expFrac;
                        if (i64 != 0)
                            significandDigit++;
                    }
                }

                d = static_cast<double>(i64);
#else
                // Use double to store significand in 32-bit architecture
                d = static_cast<double>(use64bit ? i64 : i);
#endif
                useDouble = true;
            }

            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (significandDigit < 17) {
                    d = d * 10.0 + (s.TakePush() - '0');
                    --expFrac;
                    if (RAPIDJSON_LIKELY(d > 0.0))
                        significandDigit++;
                }
                else
                    s.TakePush();
            }
        }
        else
            decimalPosition = s.Length(); // decimal position at the end of integer.

        // Parse exp = e [ minus / plus ] 1*DIGIT
        int exp = 0;
        if (Consume(s, 'e') || Consume(s, 'E')) {
            if (!useDouble) {
                d = static_cast<double>(use64bit ? i64 : i);
                useDouble = true;
            }

            bool expMinus = false;
            if (Consume(s, '+'))
                ;
            else if (Consume(s, '-'))
                expMinus = true;

            if (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                exp = static_cast<int>(s.Take() - '0');
                if (expMinus) {
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (exp >= 214748364) {                         // Issue #313: prevent overflow exponent
                            while (RAPIDJSON_UNLIKELY(s.Peek() >= '0' && s.Peek() <= '9'))  // Consume the rest of exponent
                                s.Take();
                        }
                    }
                }
                else {  // positive exp
                    int maxExp = 308 - expFrac;
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp))
                            RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                    }
                }
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissExponent, s.Tell());

            if (expMinus)
                exp = -exp;
        }

        // Finish parsing, call event according to the type of number.
        bool cont = true;

        if (parseFlags & kParseNumbersAsStringsFlag) {
            if (parseFlags & kParseInsituFlag) {
                s.Pop();  // Pop stack no matter if it will be used or not.
                typename InputStream::Ch* head = is.PutBegin();
                const size_t length = s.Tell() - startOffset;
                RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
                // unable to insert the \0 character here, it will erase the comma after this number
                const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
                cont = handler.RawNumber(str, SizeType(length), false);
            }
            else {
                SizeType numCharsToCopy = static_cast<SizeType>(s.Length());
                StringStream srcStream(s.Pop());
                StackStream<typename TargetEncoding::Ch> dstStream(stack_);
                while (numCharsToCopy--) {
                    Transcoder<UTF8<>, TargetEncoding>::Transcode(srcStream, dstStream);
                }
                dstStream.Put('\0');
                const typename TargetEncoding::Ch* str = dstStream.Pop();
                const SizeType length = static_cast<SizeType>(dstStream.Length()) - 1;
                cont = handler.RawNumber(str, SizeType(length), true);
            }
        }
        else {
           size_t length = s.Length();
           const char* decimal = s.Pop();  // Pop stack no matter if it will be used or not.

           if (useDouble) {
               int p = exp + expFrac;
               if (parseFlags & kParseFullPrecisionFlag)
                   d = internal::StrtodFullPrecision(d, p, decimal, length, decimalPosition, exp);
               else
                   d = internal::StrtodNormalPrecision(d, p);

               cont = handler.Double(minus ? -d : d);
           }
           else if (useNanOrInf) {
               cont = handler.Double(d);
           }
           else {
               if (use64bit) {
                   if (minus)
                       cont = handler.Int64(static_cast<int64_t>(~i64 + 1));
                   else
                       cont = handler.Uint64(i64);
               }
               else {
                   if (minus)
                       cont = handler.Int(static_cast<int32_t>(~i + 1));
                   else
                       cont = handler.Uint(i);
               }
           }
        }
        if (RAPIDJSON_UNLIKELY(!cont))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, startOffset);
    }